

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O3

void __thiscall
icu_63::CollationKey::CollationKey(CollationKey *this,uint8_t *newValues,int32_t count)

{
  uint8_t *puVar1;
  StackBufferOrFields *__dest;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationKey_003afba8;
  this->fFlagAndLength = count;
  this->fHashCode = 0;
  if ((-1 < count) && (newValues != (uint8_t *)0x0 || count == 0)) {
    if ((uint)count < 0x21) {
      if (count == 0) {
        return;
      }
    }
    else {
      puVar1 = reallocate(this,count,0);
      if (puVar1 == (uint8_t *)0x0) {
        count = this->fFlagAndLength;
        goto LAB_00222b69;
      }
    }
    if (this->fFlagAndLength < 0) {
      __dest = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
    }
    else {
      __dest = &this->fUnion;
    }
    memcpy(__dest,newValues,(ulong)(uint)count);
    return;
  }
LAB_00222b69:
  this->fFlagAndLength = count & 0x80000000;
  this->fHashCode = 2;
  return;
}

Assistant:

CollationKey::CollationKey(const uint8_t* newValues, int32_t count)
    : UObject(), fFlagAndLength(count),
      fHashCode(kInvalidHashCode)
{
    if (count < 0 || (newValues == NULL && count != 0) ||
            (count > getCapacity() && reallocate(count, 0) == NULL)) {
        setToBogus();
        return;
    }

    if (count > 0) {
        uprv_memcpy(getBytes(), newValues, count);
    }
}